

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocumentlayout.cpp
# Opt level: O2

void __thiscall
QTextDocumentLayoutPrivate::floatMargins
          (QTextDocumentLayoutPrivate *this,QFixed y,QTextLayoutStruct *layoutStruct,QFixed *left,
          QFixed *right)

{
  Position PVar1;
  int iVar2;
  QTextFrameData *pQVar3;
  QTextFrameData *pQVar4;
  QFixed *pQVar5;
  int i;
  ulong uVar6;
  long lVar7;
  long in_FS_OFFSET;
  QTextFormat local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  left->val = (layoutStruct->x_left).val;
  right->val = (layoutStruct->x_right).val;
  pQVar3 = ::data(layoutStruct->frame);
  lVar7 = 8;
  for (uVar6 = 0; uVar6 < (ulong)(pQVar3->floats).d.size; uVar6 = uVar6 + 1) {
    pQVar4 = ::data(*(QTextFrame **)((long)&(((pQVar3->floats).d.ptr)->wp).d + lVar7));
    if (((pQVar4->layoutDirty == false) && (iVar2 = (pQVar4->position).y.val, iVar2 <= y.val)) &&
       (y.val < iVar2 + (pQVar4->size).height.val)) {
      QTextFrame::frameFormat((QTextFrame *)&local_48);
      PVar1 = QTextFrameFormat::position((QTextFrameFormat *)&local_48);
      QTextFormat::~QTextFormat(&local_48);
      iVar2 = (pQVar4->position).x.val;
      if (PVar1 == FloatLeft) {
        iVar2 = iVar2 + (pQVar4->size).width.val;
        pQVar5 = left;
        if (iVar2 < left->val) {
          iVar2 = left->val;
        }
      }
      else {
        pQVar5 = right;
        if (right->val < iVar2) {
          iVar2 = right->val;
        }
      }
      pQVar5->val = iVar2;
    }
    lVar7 = lVar7 + 0x10;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTextDocumentLayoutPrivate::floatMargins(QFixed y, const QTextLayoutStruct *layoutStruct,
                                              QFixed *left, QFixed *right) const
{
//     qDebug() << "floatMargins y=" << y;
    *left = layoutStruct->x_left;
    *right = layoutStruct->x_right;
    QTextFrameData *lfd = data(layoutStruct->frame);
    for (int i = 0; i < lfd->floats.size(); ++i) {
        QTextFrameData *fd = data(lfd->floats.at(i));
        if (!fd->layoutDirty) {
            if (fd->position.y <= y && fd->position.y + fd->size.height > y) {
//                 qDebug() << "adjusting with float" << f << fd->position.x()<< fd->size.width();
                if (lfd->floats.at(i)->frameFormat().position() == QTextFrameFormat::FloatLeft)
                    *left = qMax(*left, fd->position.x + fd->size.width);
                else
                    *right = qMin(*right, fd->position.x);
            }
        }
    }
//     qDebug() << "floatMargins: left="<<*left<<"right="<<*right<<"y="<<y;
}